

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zonehash.cpp
# Opt level: O2

void __thiscall
asmjit::ZoneHashBase::_rehash(ZoneHashBase *this,ZoneAllocator *allocator,uint32_t primeIndex)

{
  byte bVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  ZoneHashNode **p;
  ZoneHashNode *pZVar5;
  ZoneHashNode **ppZVar6;
  ulong uVar7;
  ZoneHashNode *pZVar8;
  uint uVar9;
  
  if (0x80 < primeIndex) {
    DebugUtils::assertionFailed
              ("/workspace/llm4binary/github/license_c_cmakelists/comsec-group[P]blacksmith/build_O2/_deps/asmjit-src/src/asmjit/core/zonehash.cpp"
               ,0xbf,"primeIndex < ASMJIT_ARRAY_SIZE(ZoneHash_primeArray)");
  }
  uVar7 = (ulong)primeIndex;
  uVar2 = *(uint *)(ZoneHash_primeArray + uVar7 * 8);
  p = this->_data;
  ppZVar6 = (ZoneHashNode **)ZoneAllocator::allocZeroed(allocator,(ulong)uVar2 * 8);
  if (ppZVar6 != (ZoneHashNode **)0x0) {
    uVar3 = this->_bucketsCount;
    this->_data = ppZVar6;
    this->_bucketsCount = uVar2;
    this->_bucketsGrow = (uint32_t)(long)((double)uVar2 * 0.9);
    uVar4 = *(uint *)(ZoneHash_primeArray + uVar7 * 8 + 4);
    this->_rcpValue = uVar4;
    bVar1 = ZoneHash_primeShift[uVar7];
    this->_rcpShift = bVar1;
    this->_primeIndex = (uint8_t)primeIndex;
    for (uVar7 = 0; uVar7 != uVar3; uVar7 = uVar7 + 1) {
      pZVar8 = p[uVar7];
      while (pZVar8 != (ZoneHashNode *)0x0) {
        pZVar5 = *(ZoneHashNode **)pZVar8;
        uVar9 = *(uint *)(pZVar8 + 8) -
                (int)((ulong)*(uint *)(pZVar8 + 8) * (ulong)uVar4 >> (bVar1 & 0x3f)) * uVar2;
        *(ZoneHashNode **)pZVar8 = ppZVar6[uVar9];
        ppZVar6[uVar9] = pZVar8;
        pZVar8 = pZVar5;
      }
    }
    if (p != this->_embedded) {
      ZoneAllocator::release(allocator,p,(ulong)uVar3 << 3);
      return;
    }
  }
  return;
}

Assistant:

void ZoneHashBase::_rehash(ZoneAllocator* allocator, uint32_t primeIndex) noexcept {
  ASMJIT_ASSERT(primeIndex < ASMJIT_ARRAY_SIZE(ZoneHash_primeArray));
  uint32_t newCount = ZoneHash_primeArray[primeIndex].prime;

  ZoneHashNode** oldData = _data;
  ZoneHashNode** newData = reinterpret_cast<ZoneHashNode**>(
    allocator->allocZeroed(size_t(newCount) * sizeof(ZoneHashNode*)));

  // We can still store nodes into the table, but it will degrade.
  if (ASMJIT_UNLIKELY(newData == nullptr))
    return;

  uint32_t i;
  uint32_t oldCount = _bucketsCount;

  _data = newData;
  _bucketsCount = newCount;
  _bucketsGrow = uint32_t(newCount * 0.9);
  _rcpValue = ZoneHash_primeArray[primeIndex].rcp;
  _rcpShift = ZoneHash_primeShift[primeIndex];
  _primeIndex = uint8_t(primeIndex);

  for (i = 0; i < oldCount; i++) {
    ZoneHashNode* node = oldData[i];
    while (node) {
      ZoneHashNode* next = node->_hashNext;
      uint32_t hashMod = _calcMod(node->_hashCode);

      node->_hashNext = newData[hashMod];
      newData[hashMod] = node;
      node = next;
    }
  }

  if (oldData != _embedded)
    allocator->release(oldData, oldCount * sizeof(ZoneHashNode*));
}